

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc_tests.cpp
# Opt level: O1

void __thiscall rpc_tests::rpc_togglenetwork::test_method(rpc_togglenetwork *this)

{
  string args;
  string args_00;
  string args_01;
  string args_02;
  string args_03;
  UniValue *pUVar1;
  iterator in_R8;
  iterator pvVar2;
  iterator in_R9;
  iterator pvVar3;
  long in_FS_OFFSET;
  string_view key;
  const_string file;
  const_string file_00;
  string_view key_00;
  const_string file_01;
  string_view key_01;
  const_string file_02;
  const_string file_03;
  string_view key_02;
  const_string file_04;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  check_type cVar5;
  undefined8 in_stack_fffffffffffffbe8;
  rpc_togglenetwork *this_00;
  rpc_togglenetwork *prVar4;
  undefined8 in_stack_fffffffffffffbf8;
  undefined8 in_stack_fffffffffffffc00;
  char *local_3f8;
  char *local_3f0;
  char *local_3b8;
  char *local_3b0;
  undefined1 *local_3a8;
  undefined1 *local_3a0;
  char *local_398;
  char *local_390;
  undefined1 *local_388;
  undefined1 *local_380;
  char *local_378;
  char *local_370;
  uint local_364;
  undefined1 *local_360;
  undefined1 *local_358;
  char *local_350;
  char *local_348;
  int numConnection;
  char *local_308;
  char *local_300;
  undefined1 *local_2f8;
  undefined1 *local_2f0;
  char *local_2e8;
  char *local_2e0;
  lazy_ostream local_2d8;
  undefined1 *local_2c8;
  char *local_2c0;
  undefined1 *local_2b8;
  undefined1 *local_2b0;
  char *local_2a8;
  char *local_2a0;
  bool netState;
  uint *local_290;
  pointer local_288;
  element_type *peStack_280;
  shared_count local_278;
  uint **local_270;
  bool *local_268;
  char *local_260;
  char *local_258;
  assertion_result local_250;
  long *local_238 [2];
  long local_228 [2];
  long *local_218 [2];
  long local_208 [2];
  UniValue local_1f8;
  long *local_1a0 [2];
  long local_190 [2];
  long *local_180 [2];
  long local_170 [2];
  UniValue local_160;
  long *local_108 [2];
  long local_f8 [2];
  undefined1 local_e8 [8];
  bool local_e0 [8];
  undefined1 *local_d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_c0;
  vector<UniValue,_std::allocator<UniValue>_> local_a8;
  UniValue local_90;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_90.val._M_dataplus._M_p = (pointer)&local_90.val.field_2;
  local_90.val._M_string_length = 0;
  local_90.val.field_2._M_local_buf[0] = '\0';
  local_90.typ = VNULL;
  local_90.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_90.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_90.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_90.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_90.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_90.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_108[0] = local_f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_108,"getnetworkinfo","");
  args._M_string_length = (size_type)this;
  args._M_dataplus._M_p = (pointer)in_stack_fffffffffffffbe8;
  args.field_2._M_allocated_capacity = in_stack_fffffffffffffbf8;
  args.field_2._8_8_ = in_stack_fffffffffffffc00;
  RPCTestingSetup::CallRPC((UniValue *)local_e8,&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,args);
  local_90.typ = local_e8._0_4_;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&local_90.val,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e0);
  local_278.pi_ =
       (sp_counted_base *)
       local_90.keys.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  peStack_280 = (element_type *)
                local_90.keys.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
  local_288 = (pointer)local_90.keys.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
  local_90.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_c0.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_90.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_c0.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_90.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_c0.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_c0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_c0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_c0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_288);
  local_278.pi_ =
       (sp_counted_base *)
       local_90.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  peStack_280 = (element_type *)
                local_90.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                super__Vector_impl_data._M_finish;
  local_288 = local_90.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
              super__Vector_impl_data._M_start;
  local_90.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_a8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_90.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_a8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_90.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_a8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_a8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_a8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_a8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector
            ((vector<UniValue,_std::allocator<UniValue>_> *)&local_288);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_a8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_e0._1_7_,local_e0[0]) != &local_d0) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(local_e0._1_7_,local_e0[0]),local_d0._M_allocated_capacity + 1);
  }
  if (local_108[0] != local_f8) {
    operator_delete(local_108[0],local_f8[0] + 1);
  }
  pUVar1 = ::UniValue::get_obj(&local_90);
  key._M_str = "networkactive";
  key._M_len = 0xd;
  this_00 = this;
  pUVar1 = ::UniValue::find_value(pUVar1,key);
  netState = ::UniValue::get_bool(pUVar1);
  local_2a8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_2a0 = "";
  local_2b8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2b0 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0xb1;
  file.m_begin = (iterator)&local_2a8;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_2b8,msg);
  local_2d8.m_empty = false;
  local_2d8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abb30;
  local_2c8 = boost::unit_test::lazy_ostream::inst;
  local_2c0 = "";
  local_290 = (uint *)&numConnection;
  numConnection = CONCAT31(numConnection._1_3_,1);
  local_268 = &netState;
  local_250.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)netState;
  local_250.m_message.px = (element_type *)0x0;
  local_250.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_260 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_258 = "";
  local_d0._M_allocated_capacity = (size_type)&local_268;
  local_e0[0] = false;
  local_e8 = (undefined1  [8])&PTR__lazy_ostream_013abe90;
  local_d8 = boost::unit_test::lazy_ostream::inst;
  local_270 = &local_290;
  peStack_280 = (element_type *)((ulong)peStack_280 & 0xffffffffffffff00);
  local_288 = (pointer)&PTR__lazy_ostream_013abe90;
  local_278.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  pvVar2 = (iterator)0x1;
  pvVar3 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_250,&local_2d8,1,2,REQUIRE,0xec0096,(size_t)&local_260,0xb1,local_e8,"true",
             (vector<UniValue,_std::allocator<UniValue>_> *)&local_288);
  boost::detail::shared_count::~shared_count(&local_250.m_message.pn);
  local_180[0] = local_170;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_180,"setnetworkactive false","");
  args_00._M_string_length = (size_type)this_00;
  args_00._M_dataplus._M_p = (pointer)in_stack_fffffffffffffbe8;
  args_00.field_2._M_allocated_capacity = in_stack_fffffffffffffbf8;
  args_00.field_2._8_8_ = in_stack_fffffffffffffc00;
  RPCTestingSetup::CallRPC(&local_160,&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,args_00);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_160.values);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_160.keys);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160.val._M_dataplus._M_p != &local_160.val.field_2) {
    operator_delete(local_160.val._M_dataplus._M_p,local_160.val.field_2._M_allocated_capacity + 1);
  }
  if (local_180[0] != local_170) {
    operator_delete(local_180[0],local_170[0] + 1);
  }
  local_2e8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_2e0 = "";
  local_2f8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2f0 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar5 = 0x56cc01;
  file_00.m_end = (iterator)0xb3;
  file_00.m_begin = (iterator)&local_2e8;
  msg_00.m_end = pvVar3;
  msg_00.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_2f8,
             msg_00);
  local_288 = (pointer)CONCAT71(local_288._1_7_,1);
  peStack_280 = (element_type *)0x0;
  local_278.pi_ = (sp_counted_base *)0x0;
  local_e0[0] = false;
  local_e8 = (undefined1  [8])&PTR__lazy_ostream_013aef50;
  local_d8 = boost::unit_test::lazy_ostream::inst;
  local_d0._M_allocated_capacity = 0xec00b6;
  local_308 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_300 = "";
  pvVar2 = (iterator)0x1;
  pvVar3 = (iterator)0x1;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_288,(lazy_ostream *)local_e8,1,1,WARN,_cVar5,
             (size_t)&local_308,0xb3);
  boost::detail::shared_count::~shared_count(&local_278);
  local_1a0[0] = local_190;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a0,"getnetworkinfo","");
  args_01._M_string_length = (size_type)this_00;
  args_01._M_dataplus._M_p = (pointer)in_stack_fffffffffffffbe8;
  args_01.field_2._M_allocated_capacity = in_stack_fffffffffffffbf8;
  args_01.field_2._8_8_ = in_stack_fffffffffffffc00;
  RPCTestingSetup::CallRPC((UniValue *)local_e8,&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,args_01);
  local_90.typ = local_e8._0_4_;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&local_90.val,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e0);
  local_278.pi_ =
       (sp_counted_base *)
       local_90.keys.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  peStack_280 = (element_type *)
                local_90.keys.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
  local_288 = (pointer)local_90.keys.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
  local_90.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_c0.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_90.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_c0.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_90.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_c0.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_c0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_c0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_c0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_288);
  local_278.pi_ =
       (sp_counted_base *)
       local_90.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  peStack_280 = (element_type *)
                local_90.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                super__Vector_impl_data._M_finish;
  local_288 = local_90.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
              super__Vector_impl_data._M_start;
  local_90.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_a8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_90.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_a8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_90.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_a8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_a8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_a8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_a8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector
            ((vector<UniValue,_std::allocator<UniValue>_> *)&local_288);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_a8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_e0._1_7_,local_e0[0]) != &local_d0) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(local_e0._1_7_,local_e0[0]),
                    (ulong)(local_d0._M_allocated_capacity + 1));
  }
  if (local_1a0[0] != local_190) {
    operator_delete(local_1a0[0],local_190[0] + 1);
  }
  pUVar1 = ::UniValue::get_obj(&local_90);
  key_00._M_str = "connections";
  key_00._M_len = 0xb;
  prVar4 = this_00;
  pUVar1 = ::UniValue::find_value(pUVar1,key_00);
  numConnection = ::UniValue::getInt<int>(pUVar1);
  local_350 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_348 = "";
  local_360 = &boost::unit_test::basic_cstring<char_const>::null;
  local_358 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0xb6;
  file_01.m_begin = (iterator)&local_350;
  msg_01.m_end = pvVar3;
  msg_01.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_360,
             msg_01);
  local_2d8.m_empty = false;
  local_2d8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abb30;
  local_2c8 = boost::unit_test::lazy_ostream::inst;
  local_2c0 = "";
  local_290 = &local_364;
  local_364 = 0;
  local_250.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(numConnection == 0);
  local_250.m_message.px = (element_type *)0x0;
  local_250.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_260 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_258 = "";
  local_268 = (bool *)&numConnection;
  local_e0[0] = false;
  local_e8 = (undefined1  [8])&PTR__lazy_ostream_013abcf0;
  local_d8 = boost::unit_test::lazy_ostream::inst;
  local_d0._M_allocated_capacity = (size_type)&local_268;
  peStack_280 = (element_type *)((ulong)peStack_280 & 0xffffffffffffff00);
  local_288 = (pointer)&PTR__lazy_ostream_013abcf0;
  local_278.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_270 = &local_290;
  pvVar2 = (iterator)0x1;
  pvVar3 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_250,&local_2d8,1,2,REQUIRE,0xec0131,(size_t)&local_260,0xb6,(UniValue *)local_e8
             ,"0",(vector<UniValue,_std::allocator<UniValue>_> *)&local_288);
  boost::detail::shared_count::~shared_count(&local_250.m_message.pn);
  pUVar1 = ::UniValue::get_obj(&local_90);
  key_01._M_str = "networkactive";
  key_01._M_len = 0xd;
  pUVar1 = ::UniValue::find_value(pUVar1,key_01);
  netState = ::UniValue::get_bool(pUVar1);
  local_378 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_370 = "";
  local_388 = &boost::unit_test::basic_cstring<char_const>::null;
  local_380 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0xb9;
  file_02.m_begin = (iterator)&local_378;
  msg_02.m_end = pvVar3;
  msg_02.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_388,
             msg_02);
  local_2d8.m_empty = false;
  local_2d8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abb30;
  local_2c8 = boost::unit_test::lazy_ostream::inst;
  local_2c0 = "";
  local_364 = local_364 & 0xffffff00;
  local_250.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(netState ^ 1);
  local_250.m_message.px = (element_type *)0x0;
  local_250.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_260 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_258 = "";
  local_268 = &netState;
  local_e0[0] = false;
  local_e8 = (undefined1  [8])&PTR__lazy_ostream_013abe90;
  local_d8 = boost::unit_test::lazy_ostream::inst;
  local_d0._M_allocated_capacity = (size_type)&local_268;
  local_290 = &local_364;
  peStack_280 = (element_type *)((ulong)peStack_280 & 0xffffffffffffff00);
  local_288 = (pointer)&PTR__lazy_ostream_013abe90;
  local_278.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_270 = &local_290;
  pvVar2 = (iterator)0x1;
  pvVar3 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_250,&local_2d8,1,2,REQUIRE,0xec0096,(size_t)&local_260,0xb9,(UniValue *)local_e8
             ,"false",(vector<UniValue,_std::allocator<UniValue>_> *)&local_288);
  boost::detail::shared_count::~shared_count(&local_250.m_message.pn);
  local_218[0] = local_208;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_218,"setnetworkactive true","");
  args_02._M_string_length = (size_type)prVar4;
  args_02._M_dataplus._M_p = (pointer)in_stack_fffffffffffffbe8;
  args_02.field_2._M_allocated_capacity = in_stack_fffffffffffffbf8;
  args_02.field_2._8_8_ = in_stack_fffffffffffffc00;
  RPCTestingSetup::CallRPC(&local_1f8,&this_00->super_BOOST_AUTO_TEST_CASE_FIXTURE,args_02);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_1f8.values);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1f8.keys);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8.val._M_dataplus._M_p != &local_1f8.val.field_2) {
    operator_delete(local_1f8.val._M_dataplus._M_p,local_1f8.val.field_2._M_allocated_capacity + 1);
  }
  if (local_218[0] != local_208) {
    operator_delete(local_218[0],local_208[0] + 1);
  }
  local_398 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_390 = "";
  local_3a8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3a0 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar5 = 0x56d1ca;
  file_03.m_end = (iterator)0xbb;
  file_03.m_begin = (iterator)&local_398;
  msg_03.m_end = pvVar3;
  msg_03.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_3a8,
             msg_03);
  local_288 = (pointer)CONCAT71(local_288._1_7_,1);
  peStack_280 = (element_type *)0x0;
  local_278.pi_ = (sp_counted_base *)0x0;
  local_e0[0] = false;
  local_e8 = (undefined1  [8])&PTR__lazy_ostream_013abd70;
  local_d8 = boost::unit_test::lazy_ostream::inst;
  local_d0._M_allocated_capacity = 0xec0155;
  local_3b8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_3b0 = "";
  pvVar2 = (iterator)0x1;
  pvVar3 = (iterator)0x1;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_288,(lazy_ostream *)local_e8,1,1,WARN,_cVar5,
             (size_t)&local_3b8,0xbb);
  boost::detail::shared_count::~shared_count(&local_278);
  local_238[0] = local_228;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_238,"getnetworkinfo","");
  args_03._M_string_length = (size_type)prVar4;
  args_03._M_dataplus._M_p = (pointer)in_stack_fffffffffffffbe8;
  args_03.field_2._M_allocated_capacity = in_stack_fffffffffffffbf8;
  args_03.field_2._8_8_ = in_stack_fffffffffffffc00;
  RPCTestingSetup::CallRPC
            ((UniValue *)local_e8,&this_00->super_BOOST_AUTO_TEST_CASE_FIXTURE,args_03);
  local_90.typ = local_e8._0_4_;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&local_90.val,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e0);
  local_278.pi_ =
       (sp_counted_base *)
       local_90.keys.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  peStack_280 = (element_type *)
                local_90.keys.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
  local_288 = (pointer)local_90.keys.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
  local_90.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_c0.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_90.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_c0.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_90.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_c0.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_c0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_c0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_c0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_288);
  local_278.pi_ =
       (sp_counted_base *)
       local_90.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  peStack_280 = (element_type *)
                local_90.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                super__Vector_impl_data._M_finish;
  local_288 = local_90.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
              super__Vector_impl_data._M_start;
  local_90.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_a8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_90.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_a8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_90.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_a8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_a8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_a8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_a8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector
            ((vector<UniValue,_std::allocator<UniValue>_> *)&local_288);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_a8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_e0._1_7_,local_e0[0]) != &local_d0) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(local_e0._1_7_,local_e0[0]),
                    (ulong)(local_d0._M_allocated_capacity + 1));
  }
  if (local_238[0] != local_228) {
    operator_delete(local_238[0],local_228[0] + 1);
  }
  pUVar1 = ::UniValue::get_obj(&local_90);
  key_02._M_str = "networkactive";
  key_02._M_len = 0xd;
  pUVar1 = ::UniValue::find_value(pUVar1,key_02);
  netState = ::UniValue::get_bool(pUVar1);
  local_3f8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_3f0 = "";
  file_04.m_end = (iterator)0xbe;
  file_04.m_begin = (iterator)&local_3f8;
  msg_04.m_end = pvVar3;
  msg_04.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,
             (size_t)&stack0xfffffffffffffbf8,msg_04);
  local_2d8.m_empty = false;
  local_2d8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abb30;
  local_2c8 = boost::unit_test::lazy_ostream::inst;
  local_2c0 = "";
  local_364 = CONCAT31(local_364._1_3_,1);
  local_250.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)netState;
  local_250.m_message.px = (element_type *)0x0;
  local_250.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_260 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_258 = "";
  local_268 = &netState;
  local_e0[0] = false;
  local_e8 = (undefined1  [8])&PTR__lazy_ostream_013abe90;
  local_d8 = boost::unit_test::lazy_ostream::inst;
  local_d0._M_allocated_capacity = (size_type)&local_268;
  local_290 = &local_364;
  peStack_280 = (element_type *)((ulong)peStack_280 & 0xffffffffffffff00);
  local_288 = (pointer)&PTR__lazy_ostream_013abe90;
  local_278.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_270 = &local_290;
  boost::test_tools::tt_detail::report_assertion
            (&local_250,&local_2d8,1,2,REQUIRE,0xec0096,(size_t)&local_260,0xbe,(UniValue *)local_e8
             ,"true",(vector<UniValue,_std::allocator<UniValue>_> *)&local_288);
  boost::detail::shared_count::~shared_count(&local_250.m_message.pn);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_90.values);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_90.keys);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90.val._M_dataplus._M_p != &local_90.val.field_2) {
    operator_delete(local_90.val._M_dataplus._M_p,
                    CONCAT71(local_90.val.field_2._M_allocated_capacity._1_7_,
                             local_90.val.field_2._M_local_buf[0]) + 1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(rpc_togglenetwork)
{
    UniValue r;

    r = CallRPC("getnetworkinfo");
    bool netState = r.get_obj().find_value("networkactive").get_bool();
    BOOST_CHECK_EQUAL(netState, true);

    BOOST_CHECK_NO_THROW(CallRPC("setnetworkactive false"));
    r = CallRPC("getnetworkinfo");
    int numConnection = r.get_obj().find_value("connections").getInt<int>();
    BOOST_CHECK_EQUAL(numConnection, 0);

    netState = r.get_obj().find_value("networkactive").get_bool();
    BOOST_CHECK_EQUAL(netState, false);

    BOOST_CHECK_NO_THROW(CallRPC("setnetworkactive true"));
    r = CallRPC("getnetworkinfo");
    netState = r.get_obj().find_value("networkactive").get_bool();
    BOOST_CHECK_EQUAL(netState, true);
}